

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void load_area(FILE *fp)

{
  int iVar1;
  AREA_DATA_conflict *pAVar2;
  char *pcVar3;
  
  pAVar2 = (AREA_DATA_conflict *)operator_new(0x170);
  pcVar3 = fread_string(fp);
  pAVar2->file_name = pcVar3;
  pAVar2->prev = (AREA_DATA_conflict *)0x0;
  zero_vector(pAVar2->area_flags);
  *(byte *)pAVar2->area_flags = (byte)pAVar2->area_flags[0] | 0x20;
  pAVar2->vnum = top_area;
  pAVar2->affected = (AREA_AFFECT_DATA *)0x0;
  pcVar3 = fread_string(fp);
  pAVar2->name = pcVar3;
  pcVar3 = fread_string(fp);
  pAVar2->credits = pcVar3;
  iVar1 = fread_number(fp);
  pAVar2->low_range = (short)iVar1;
  iVar1 = fread_number(fp);
  pAVar2->high_range = (short)iVar1;
  iVar1 = fread_number(fp);
  pAVar2->min_vnum = (short)iVar1;
  iVar1 = fread_number(fp);
  pAVar2->max_vnum = (short)iVar1;
  fread_word(fp);
  iVar1 = flag_lookup(fread_word::word,area_type_table);
  pAVar2->area_type = (short)iVar1;
  fread_word(fp);
  iVar1 = climate_lookup(fread_word::word);
  pAVar2->climate = (short)iVar1;
  fread_flag_new(pAVar2->area_flags,fp);
  iVar1 = fread_number(fp);
  pAVar2->security = iVar1;
  pcVar3 = fread_string(fp);
  pAVar2->builders = pcVar3;
  pAVar2->age = 0xf;
  pAVar2->nplayer = 0;
  pAVar2->empty = false;
  zero_vector(pAVar2->affected_by);
  zero_vector(pAVar2->progtypes);
  pAVar2->aprogs = (APROG_DATA *)0x0;
  pAVar2->sky = 0;
  pAVar2->temp = 0;
  if (area_first == (AREA_DATA_conflict *)0x0) {
    area_first = pAVar2;
  }
  if (area_last != (AREA_DATA_conflict *)0x0) {
    area_last->next = pAVar2;
    pAVar2->prev = area_last;
    *(byte *)area_last->area_flags = (byte)area_last->area_flags[0] & 0xdf;
  }
  pAVar2->next = (AREA_DATA_conflict *)0x0;
  area_last = pAVar2;
  top_area = top_area + 1;
  return;
}

Assistant:

void load_area(FILE *fp)
{
	AREA_DATA *pArea;

	pArea = new AREA_DATA;
	/*
	pArea->reset_first	= nullptr;
	pArea->reset_last	= nullptr;
	*/
	pArea->file_name = fread_string(fp);

	pArea->prev = nullptr;

	zero_vector(pArea->area_flags);
	SET_BIT(pArea->area_flags, AREA_LOADING); /* OLC */
	pArea->vnum = top_area;					  /* OLC */
	pArea->affected = nullptr;
	pArea->name = fread_string(fp);
	pArea->credits = fread_string(fp);
	pArea->low_range = fread_number(fp);
	pArea->high_range = fread_number(fp);
	pArea->min_vnum = fread_number(fp);
	pArea->max_vnum = fread_number(fp);
	pArea->area_type = flag_lookup(fread_word(fp), area_type_table);
	pArea->climate = climate_lookup(fread_word(fp));
	fread_flag_new(pArea->area_flags, fp);

	pArea->security = fread_number(fp);
	pArea->builders = fread_string(fp);
	pArea->age = 15;
	pArea->nplayer = 0;
	pArea->empty= false;
	pArea->nplayer = 0;
	zero_vector(pArea->affected_by);

	/* Morg - Valgrind fix. */
	zero_vector(pArea->progtypes);
	pArea->aprogs = nullptr;
	pArea->temp = 0;
	pArea->sky = 0;

	if (!area_first)
		area_first = pArea;

	if (area_last)
	{
		area_last->next = pArea;
		pArea->prev = area_last;

		REMOVE_BIT(area_last->area_flags, AREA_LOADING); /* OLC */
	}

	area_last = pArea;
	pArea->next = nullptr;

	top_area++;
}